

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::Operation::Operation
          (Operation *this,char *name,bool useSync,bool serverSync)

{
  FenceSync *this_00;
  bool serverSync_local;
  bool useSync_local;
  char *name_local;
  Operation *this_local;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,name);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Operation_032674a0;
  this->m_useSync = useSync;
  this->m_serverSync = serverSync;
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::vector(&this->m_syncDeps);
  if (useSync) {
    this_00 = (FenceSync *)operator_new(0x20);
    FenceSync::FenceSync(this_00);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr(&this->m_sync,this_00);
  }
  else {
    de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::SharedPtr(&this->m_sync);
  }
  return;
}

Assistant:

Operation::Operation (const char* name, bool useSync, bool serverSync)
	: tcu::ThreadUtil::Operation	(name)
	, m_useSync						(useSync)
	, m_serverSync					(serverSync)
	, m_sync						(useSync ? SharedPtr<FenceSync>(new FenceSync()) : SharedPtr<FenceSync>())
{
}